

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O1

void TTD::NSLogEvents::JsRTCallFunctionAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint uVar1;
  long lVar2;
  int32 iVar3;
  uint32 uVar4;
  TTDVar pvVar5;
  void **ppvVar6;
  int64 iVar7;
  byte *pbVar8;
  ulong uVar9;
  
  if (evt->EventKind == CallExistingFunctionActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar5 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar5;
    iVar3 = FileReader::ReadInt32(reader,rootNestingDepth,true);
    *(int32 *)&evt[1].EventTimeStamp = iVar3;
    uVar4 = FileReader::ReadLengthValue(reader,true);
    *(uint32 *)((long)&evt[1].EventTimeStamp + 4) = uVar4;
    ppvVar6 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)uVar4);
    *(void ***)(evt + 2) = ppvVar6;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (*(int *)((long)&evt[1].EventTimeStamp + 4) != 0) {
      uVar9 = 0;
      do {
        pvVar5 = NSSnapValues::ParseTTDVar(uVar9 != 0,reader);
        *(TTDVar *)(*(long *)(evt + 2) + uVar9 * 8) = pvVar5;
        uVar9 = uVar9 + 1;
      } while (uVar9 < *(uint *)((long)&evt[1].EventTimeStamp + 4));
    }
    (*reader->_vptr_FileReader[5])(reader);
    iVar7 = FileReader::ReadInt64(reader,eventTime,true);
    evt[2].EventTimeStamp = iVar7;
    iVar7 = FileReader::ReadInt64(reader,eventTime,true);
    evt[3].EventKind = (int)iVar7;
    evt[3].ResultStatus = (int)((ulong)iVar7 >> 0x20);
    pbVar8 = SlabAllocatorBase<8>::SlabAllocateTypeRawSize<80ul>(alloc);
    evt[3].EventTimeStamp = (int64)pbVar8;
    pbVar8[0] = '\0';
    pbVar8[1] = '\0';
    pbVar8[2] = '\0';
    pbVar8[3] = '\0';
    pbVar8[4] = '\0';
    pbVar8[5] = '\0';
    pbVar8[6] = '\0';
    pbVar8[7] = '\0';
    uVar1 = *(uint *)((long)&evt[1].EventTimeStamp + 4);
    if (uVar1 < 2) {
      ppvVar6 = (void **)0x0;
    }
    else {
      ppvVar6 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(uVar1 - 1));
    }
    lVar2 = evt[3].EventTimeStamp;
    *(void ***)(lVar2 + 8) = ppvVar6;
    TTDebuggerSourceLocation::Initialize((TTDebuggerSourceLocation *)(lVar2 + 0x10));
    iVar7 = FileReader::ReadInt64(reader,i64Val,true);
    evt[4].EventKind = (int)iVar7;
    evt[4].ResultStatus = (int)((ulong)iVar7 >> 0x20);
    (*reader->_vptr_FileReader[3])(reader,0x37,1);
    (*reader->_vptr_FileReader[0x14])(reader,alloc,&evt[4].EventTimeStamp,0);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCallFunctionAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            cfAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            cfAction->CallbackDepth = reader->ReadInt32(NSTokens::Key::rootNestingDepth, true);

            cfAction->ArgCount = reader->ReadLengthValue(true);
            cfAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(cfAction->ArgCount);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < cfAction->ArgCount; ++i)
            {
                cfAction->ArgArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }
            reader->ReadSequenceEnd();

            cfAction->CallEventTime = reader->ReadInt64(NSTokens::Key::eventTime, true);

            cfAction->TopLevelCallbackEventTime = reader->ReadInt64(NSTokens::Key::eventTime, true);

            cfAction->AdditionalReplayInfo = alloc.SlabAllocateStruct<JsRTCallFunctionAction_ReplayAdditionalInfo>();

            cfAction->AdditionalReplayInfo->RtRSnap = nullptr;
            cfAction->AdditionalReplayInfo->ExecArgs = (cfAction->ArgCount > 1) ? alloc.SlabAllocateArray<Js::Var>(cfAction->ArgCount - 1) : nullptr; //ArgCount includes slot for function which we don't use in exec

            cfAction->AdditionalReplayInfo->LastExecutedLocation.Initialize();

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            cfAction->LastNestedEvent = reader->ReadInt64(NSTokens::Key::i64Val, true);
            reader->ReadString(NSTokens::Key::name, alloc, cfAction->FunctionName, true);
#endif
        }